

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnAtomicFenceExpr
          (BinaryReaderInterp *this,uint32_t consistency_model)

{
  bool bVar1;
  Location local_40;
  Enum local_20;
  uint32_t local_1c;
  BinaryReaderInterp *pBStack_18;
  uint32_t consistency_model_local;
  BinaryReaderInterp *this_local;
  
  local_1c = consistency_model;
  pBStack_18 = this;
  GetLocation(&local_40,this);
  local_20 = (Enum)SharedValidator::OnAtomicFence(&this->validator_,&local_40,local_1c);
  bVar1 = Failed((Result)local_20);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    Istream::Emit(this->istream_,AtomicFence,local_1c);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnAtomicFenceExpr(uint32_t consistency_model) {
  CHECK_RESULT(validator_.OnAtomicFence(GetLocation(), consistency_model));
  istream_.Emit(Opcode::AtomicFence, consistency_model);
  return Result::Ok;
}